

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateCommandSetInclusive
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,
          vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          vectorParams,bool unique,
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          *flags,bool raii,bool raiiFactory,
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          *raiiFlags)

{
  CommandFlavourFlags CVar1;
  _Base_ptr p_Var2;
  MaskType *pMVar3;
  int iVar4;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *pmVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  _Base_ptr p_Var7;
  MaskType *pMVar8;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enhancedCommands;
  
  if ((generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
       ::emptyReturnParams == '\0') &&
     (iVar4 = __cxa_guard_acquire(&generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
                                   ::emptyReturnParams), iVar4 != 0)) {
    generateCommandSetInclusive::emptyReturnParams.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    generateCommandSetInclusive::emptyReturnParams.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    generateCommandSetInclusive::emptyReturnParams.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                 &generateCommandSetInclusive::emptyReturnParams,&__dso_handle);
    __cxa_guard_release(&generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
                         ::emptyReturnParams);
  }
  if ((generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
       ::emptyVectorParams == '\0') &&
     (iVar4 = __cxa_guard_acquire(&generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
                                   ::emptyVectorParams), iVar4 != 0)) {
    generateCommandSetInclusive::emptyVectorParams._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = _S_red;
    generateCommandSetInclusive::emptyVectorParams._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    generateCommandSetInclusive::emptyVectorParams._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &generateCommandSetInclusive::emptyVectorParams._M_t._M_impl.super__Rb_tree_header.
               _M_header;
    generateCommandSetInclusive::emptyVectorParams._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &generateCommandSetInclusive::emptyVectorParams._M_t._M_impl.super__Rb_tree_header.
                _M_header;
    generateCommandSetInclusive::emptyVectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count
         = 0;
    __cxa_atexit(std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::~map,&generateCommandSetInclusive::emptyVectorParams,&__dso_handle);
    __cxa_guard_release(&generateCommandSetInclusive(std::__cxx11::string_const&,VulkanHppGenerator::CommandData_const&,unsigned_long,bool,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::map<unsigned_long,VulkanHppGenerator::VectorParamData,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&,bool,bool,std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>const&)
                         ::emptyVectorParams);
  }
  if ((undefined1)vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color == _S_red) {
    enhancedCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    enhancedCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    enhancedCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniqueCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uniqueCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uniqueCommands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pMVar3 = *(MaskType **)(vectorParams._M_t._M_impl._0_8_ + 8);
    for (pMVar8 = *(MaskType **)vectorParams._M_t._M_impl._0_8_; pMVar8 != pMVar3;
        pMVar8 = pMVar8 + 1) {
      CVar1.m_mask = *pMVar8;
      if ((CVar1.m_mask & 0x20) != 0 &&
          (char)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
        __assert_fail("!noReturn || !unique",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x11f9,
                      "std::string VulkanHppGenerator::generateCommandSetInclusive(const std::string &, const CommandData &, size_t, bool, std::vector<size_t>, std::map<size_t, VectorParamData>, bool, const std::vector<CommandFlavourFlags> &, bool, bool, const std::vector<CommandFlavourFlags> &) const"
                     );
      }
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pmVar5 = (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if ((CVar1.m_mask >> 5 & 1) != 0) {
        pvVar6 = &generateCommandSetInclusive::emptyReturnParams;
        pmVar5 = &generateCommandSetInclusive::emptyVectorParams;
      }
      generateCommandEnhanced
                (&local_88,this,name,commandData,initialSkipCount,definition,pmVar5,pvVar6,CVar1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &enhancedCommands,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if ((char)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage != '\0') {
        generateCommandEnhanced
                  (&local_88,this,name,commandData,initialSkipCount,definition,
                   (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,(CommandFlavourFlags)(CVar1.m_mask | 8))
        ;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &uniqueCommands,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    generateCommandStandard(&local_88,this,name,commandData,initialSkipCount,definition);
    generateCommandSet(__return_storage_ptr__,this,definition,&local_88,&enhancedCommands,
                       &uniqueCommands);
    std::__cxx11::string::~string((string *)&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&uniqueCommands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&enhancedCommands);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    p_Var7 = *(_Base_ptr *)vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->_M_parent;
    if (p_Var7 == p_Var2) {
      generateRAIIHandleCommandStandard(&local_88,this,name,commandData,initialSkipCount,definition)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      for (; p_Var7 != p_Var2; p_Var7 = (_Base_ptr)((long)&p_Var7->_M_color + 1)) {
        CVar1.m_mask = (MaskType)p_Var7->_M_color;
        if ((CVar1.m_mask & 0x20) != 0 &&
            (char)vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == '\x01') {
          __assert_fail("!noReturn || !raiiFactory",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x11e6,
                        "std::string VulkanHppGenerator::generateCommandSetInclusive(const std::string &, const CommandData &, size_t, bool, std::vector<size_t>, std::map<size_t, VectorParamData>, bool, const std::vector<CommandFlavourFlags> &, bool, bool, const std::vector<CommandFlavourFlags> &) const"
                       );
        }
        if ((char)vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == '\0') {
          pmVar5 = (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((CVar1.m_mask >> 5 & 1) != 0) {
            pmVar5 = &generateCommandSetInclusive::emptyVectorParams;
            pvVar6 = &generateCommandSetInclusive::emptyReturnParams;
          }
          generateRAIIHandleCommandEnhanced
                    (&local_88,this,name,commandData,initialSkipCount,pvVar6,pmVar5,definition,CVar1
                    );
        }
        else {
          generateRAIIHandleCommandFactory
                    (&local_88,this,name,commandData,initialSkipCount,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      *)returnParams.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish,definition,CVar1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandSetInclusive( std::string const &                      name,
                                                             CommandData const &                      commandData,
                                                             size_t                                   initialSkipCount,
                                                             bool                                     definition,
                                                             std::vector<size_t>                      returnParams,
                                                             std::map<size_t, VectorParamData>        vectorParams,
                                                             bool                                     unique,
                                                             std::vector<CommandFlavourFlags> const & flags,
                                                             bool                                     raii,
                                                             bool                                     raiiFactory,
                                                             std::vector<CommandFlavourFlags> const & raiiFlags ) const
{
  static const std::vector<size_t>               emptyReturnParams;
  static const std::map<size_t, VectorParamData> emptyVectorParams;
  if ( raii )
  {
    std::string raiiCommands;
    if ( raiiFlags.empty() )
    {
      // Functions without enhancements need to have a standard implementation
      raiiCommands = generateRAIIHandleCommandStandard( name, commandData, initialSkipCount, definition );
    }
    else
    {
      for ( auto flag : raiiFlags )
      {
        const bool noReturn = flag & CommandFlavourFlagBits::noReturn;
        assert( !noReturn || !raiiFactory );  // noReturn => !raiiFactory
        raiiCommands += raiiFactory ? generateRAIIHandleCommandFactory( name, commandData, initialSkipCount, returnParams, vectorParams, definition, flag )
                                    : generateRAIIHandleCommandEnhanced( name,
                                                                         commandData,
                                                                         initialSkipCount,
                                                                         noReturn ? emptyReturnParams : returnParams,
                                                                         noReturn ? emptyVectorParams : vectorParams,
                                                                         definition,
                                                                         flag );
      }
    }
    return raiiCommands;
  }
  else
  {
    std::vector<std::string> enhancedCommands, uniqueCommands;
    for ( auto flag : flags )
    {
      const bool noReturn = flag & CommandFlavourFlagBits::noReturn;
      assert( !noReturn || !unique );  // noReturn => !unique
      enhancedCommands.push_back( generateCommandEnhanced(
        name, commandData, initialSkipCount, definition, noReturn ? emptyVectorParams : vectorParams, noReturn ? emptyReturnParams : returnParams, flag ) );
      if ( unique )
      {
        uniqueCommands.push_back(
          generateCommandEnhanced( name, commandData, initialSkipCount, definition, vectorParams, returnParams, flag | CommandFlavourFlagBits::unique ) );
      }
    }
    return generateCommandSet( definition, generateCommandStandard( name, commandData, initialSkipCount, definition ), enhancedCommands, uniqueCommands );
  }
}